

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O2

void __thiscall MPEGStreamReader::checkPulldownSync(MPEGStreamReader *this)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  
  lVar1 = this->m_curDts * 5 + this->m_testPulldownDts * -4;
  lVar3 = -lVar1;
  if (0 < lVar1) {
    lVar3 = lVar1;
  }
  if ((this->m_testPulldownDts != 0) &&
     (lVar1 = this->m_pulldownWarnCnt * 500000000,
     lVar3 != lVar1 && SBORROW8(lVar3,lVar1) == lVar3 + this->m_pulldownWarnCnt * -500000000 < 0)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Warning! Source stream contain irregular pulldown marks. Mistiming between original fps and fps/1.25 (without pulldown) exceeds "
                            );
    poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
    poVar2 = std::operator<<(poVar2,"ms.");
    std::endl<char,std::char_traits<char>>(poVar2);
    sLastMsg = true;
    this->m_pulldownWarnCnt = this->m_pulldownWarnCnt << 1;
  }
  return;
}

Assistant:

void MPEGStreamReader::checkPulldownSync()
{
    int64_t asyncValue = m_curDts * 5 - m_testPulldownDts * 4;
    if (asyncValue < 0)
        asyncValue = -asyncValue;

    if (m_testPulldownDts != 0 && asyncValue > 5 * MAX_PULLDOWN_ASYNC * m_pulldownWarnCnt)
    {
        LTRACE(LT_ERROR, 2,
               "Warning! Source stream contain irregular pulldown marks. Mistiming between original fps and "
               "fps/1.25 (without pulldown) exceeds "
                   << (asyncValue / 5000000ll) << "ms.");
        m_pulldownWarnCnt *= 2;
    }
}